

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  BYTE *pBVar3;
  byte bVar4;
  byte bVar5;
  undefined2 uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  sbyte sVar10;
  int iVar11;
  BIT_DStream_status BVar12;
  size_t sVar13;
  long lVar14;
  size_t sVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  BYTE *pBVar19;
  ulong uVar20;
  undefined1 *puVar21;
  int iVar22;
  ulong uVar23;
  ulong *puVar24;
  long lVar25;
  byte *srcBuffer;
  int iVar26;
  BYTE *pBVar27;
  int iVar28;
  char cVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 *puVar35;
  ulong uVar36;
  BYTE *pBVar37;
  size_t *psVar38;
  undefined1 *puVar39;
  bool bVar40;
  uint uStack_214;
  undefined1 *puStack_210;
  BIT_DStream_t BStack_208;
  BYTE *pBStack_1d8;
  uint uStack_1cc;
  undefined1 auStack_1c8 [16];
  ulong *puStack_1b8;
  ulong *puStack_1b0;
  ulong *puStack_1a8;
  undefined1 *puStack_198;
  ulong uStack_190;
  undefined1 auStack_188 [8];
  BYTE *pBStack_180;
  size_t *psStack_178;
  size_t *psStack_170;
  size_t *psStack_168;
  ulong uStack_160;
  undefined1 *puStack_158;
  ulong *puStack_150;
  size_t sStack_148;
  ulong *puStack_140;
  size_t sStack_138;
  ulong uStack_130;
  size_t *psStack_128;
  ulong *puStack_120;
  undefined1 *puStack_118;
  undefined1 *puStack_110;
  HUF_DecompressFastArgs HStack_108;
  ulong *puStack_68;
  undefined1 *puStack_60;
  ulong *puStack_58;
  size_t *psStack_50;
  ulong uStack_48;
  ulong *puStack_40;
  ulong *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar13 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar13;
  }
  sStack_148 = maxDstSize;
  if ((flags & 0x20U) == 0) {
    sVar13 = HUF_DecompressFastArgs_init(&HStack_108,dst,maxDstSize,cSrc,cSrcSize,DTable);
    if (sVar13 - 1 < 0xffffffffffffff88) {
      if (HStack_108.ip[0] < HStack_108.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x329,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      pBVar37 = (BYTE *)((long)cSrc + 6);
      pBVar3 = (BYTE *)((long)dst + maxDstSize);
      BStack_208.bitContainer = HStack_108.bits[0];
      BStack_208._8_8_ = HStack_108.bits[1];
      BStack_208.ptr = (char *)HStack_108.bits[2];
      BStack_208.start = (char *)HStack_108.bits[3];
      auStack_1c8._0_8_ = HStack_108.ip[0];
      auStack_1c8._8_8_ = HStack_108.ip[1];
      puStack_1b8 = (ulong *)HStack_108.ip[2];
      puStack_1b0 = (ulong *)HStack_108.ip[3];
      auStack_188 = (undefined1  [8])HStack_108.op[0];
      pBStack_180 = HStack_108.op[1];
      psStack_178 = (size_t *)HStack_108.op[2];
      psStack_170 = (size_t *)HStack_108.op[3];
      lVar14 = 0;
      while( true ) {
        do {
          pBVar19 = HStack_108.oend;
          if (lVar14 != 3) {
            pBVar19 = (&pBStack_180)[lVar14];
          }
          if (pBVar19 < *(BYTE **)(auStack_188 + lVar14 * 8)) {
            __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2c9,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          if (*(BYTE **)(auStack_1c8 + lVar14 * 8) < HStack_108.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2ca,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        uVar17 = (ulong)((long)HStack_108.oend - (long)psStack_170) / 5;
        uVar23 = (ulong)(auStack_1c8._0_8_ - (long)HStack_108.ilimit) / 7;
        if (uVar17 < uVar23) {
          uVar23 = uVar17;
        }
        if (((((long)(uVar23 * 5) < 0x14) || ((ulong)auStack_1c8._8_8_ < (ulong)auStack_1c8._0_8_))
            || (puStack_1b8 < (ulong)auStack_1c8._8_8_)) || (puStack_1b0 < puStack_1b8)) break;
        pBVar19 = (BYTE *)((long)psStack_170 + uVar23 * 5);
        lVar18 = 0;
        do {
          do {
            lVar14 = 0;
            do {
              uVar6 = *(undefined2 *)
                       ((long)HStack_108.dt + ((&BStack_208.bitContainer)[lVar14] >> 0x35) * 2);
              (&BStack_208.bitContainer)[lVar14] =
                   (&BStack_208.bitContainer)[lVar14] << ((byte)uVar6 & 0x3f);
              *(char *)(*(long *)(auStack_188 + lVar14 * 8) + lVar18) = (char)((ushort)uVar6 >> 8);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 4);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 5);
          lVar14 = 0;
          do {
            uVar23 = (&BStack_208.bitContainer)[lVar14];
            if (uVar23 == 0) {
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                            ,0x5c,"unsigned int ZSTD_countTrailingZeros64(U64)");
            }
            uVar17 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            *(long *)(auStack_188 + lVar14 * 8) = *(long *)(auStack_188 + lVar14 * 8) + 5;
            puVar24 = (ulong *)(*(long *)(auStack_1c8 + lVar14 * 8) - (uVar17 >> 3 & 0x1fffffff));
            *(ulong **)(auStack_1c8 + lVar14 * 8) = puVar24;
            (&BStack_208.bitContainer)[lVar14] = (*puVar24 | 1) << ((byte)uVar17 & 7);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          lVar14 = 0;
          lVar18 = 0;
        } while (psStack_170 < pBVar19);
      }
      HStack_108.bits[2] = (U64)BStack_208.ptr;
      HStack_108.bits[3] = (U64)BStack_208.start;
      HStack_108.bits[0] = BStack_208.bitContainer;
      HStack_108.bits[1] = BStack_208._8_8_;
      HStack_108.ip[0] = (BYTE *)auStack_1c8._0_8_;
      HStack_108.ip[1] = (BYTE *)auStack_1c8._8_8_;
      HStack_108.ip[2] = (BYTE *)puStack_1b8;
      HStack_108.ip[3] = (BYTE *)puStack_1b0;
      HStack_108.op[2] = (BYTE *)psStack_178;
      HStack_108.op[3] = (BYTE *)psStack_170;
      HStack_108.op[0] = (BYTE *)auStack_188;
      HStack_108.op[1] = pBStack_180;
      if ((ulong)auStack_1c8._0_8_ < pBVar37) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x32f,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if ((ulong)auStack_1c8._8_8_ < pBVar37) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x330,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (puStack_1b8 < pBVar37) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x331,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (puStack_1b0 < pBVar37) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x332,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (pBVar3 < psStack_170) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x333,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      pBVar37 = (BYTE *)(maxDstSize + 3 >> 2);
      lVar14 = 0;
      pBStack_1d8 = pBVar37;
LAB_0021de81:
      uVar23 = (long)pBVar3 - (long)dst;
      dst = (BYTE *)((long)dst + (long)pBVar37);
      if (uVar23 < pBVar37) {
        dst = pBVar3;
      }
      sVar13 = HUF_initRemainingDStream(&BStack_208,&HStack_108,(int)lVar14,(BYTE *)dst);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
      pBVar19 = HStack_108.op[lVar14];
      lVar18 = (long)dst - (long)pBVar19;
      pBVar27 = pBVar19;
      if (3 < lVar18) {
        if (BStack_208.bitsConsumed < 0x41) {
          do {
            if (BStack_208.ptr < BStack_208.limitPtr) {
              if (BStack_208.ptr == BStack_208.start) goto LAB_0021e015;
              bVar40 = BStack_208.start <=
                       (U64 *)((long)BStack_208.ptr - (ulong)(BStack_208.bitsConsumed >> 3));
              uVar30 = (int)BStack_208.ptr - (int)BStack_208.start;
              if (bVar40) {
                uVar30 = BStack_208.bitsConsumed >> 3;
              }
              BStack_208.bitsConsumed = BStack_208.bitsConsumed + uVar30 * -8;
            }
            else {
              uVar30 = BStack_208.bitsConsumed >> 3;
              BStack_208.bitsConsumed = BStack_208.bitsConsumed & 7;
              bVar40 = true;
            }
            BStack_208.ptr = (char *)((long)BStack_208.ptr - (ulong)uVar30);
            BStack_208.bitContainer = *(size_t *)BStack_208.ptr;
            if (((BYTE *)((long)dst + -3) <= pBVar27) || (!bVar40)) goto LAB_0021e015;
            uVar23 = (BStack_208.bitContainer << ((byte)BStack_208.bitsConsumed & 0x3f)) >> 0x35;
            iVar11 = *(byte *)((long)DTable + uVar23 * 2 + 4) + BStack_208.bitsConsumed;
            *pBVar27 = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
            uVar23 = (BStack_208.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            iVar11 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
            pBVar27[1] = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
            uVar23 = (BStack_208.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            iVar11 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
            pBVar27[2] = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
            uVar23 = (BStack_208.bitContainer << ((byte)iVar11 & 0x3f)) >> 0x35;
            BStack_208.bitsConsumed = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
            pBVar27[3] = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
            pBVar27 = pBVar27 + 4;
            if (0x40 < BStack_208.bitsConsumed) goto LAB_0021e015;
          } while( true );
        }
        goto LAB_0021e027;
      }
      if (BStack_208.bitsConsumed < 0x41) {
        if (BStack_208.ptr < BStack_208.limitPtr) {
          if (BStack_208.ptr == BStack_208.start) goto LAB_0021e056;
          uVar30 = (int)BStack_208.ptr - (int)BStack_208.start;
          if (BStack_208.start <=
              (U64 *)((long)BStack_208.ptr - (ulong)(BStack_208.bitsConsumed >> 3))) {
            uVar30 = BStack_208.bitsConsumed >> 3;
          }
          BStack_208.ptr = (char *)((long)BStack_208.ptr - (ulong)uVar30);
          BStack_208.bitsConsumed = BStack_208.bitsConsumed + uVar30 * -8;
        }
        else {
          BStack_208.ptr = (char *)((long)BStack_208.ptr - (ulong)(BStack_208.bitsConsumed >> 3));
          BStack_208.bitsConsumed = BStack_208.bitsConsumed & 7;
        }
        BStack_208.bitContainer = *(U64 *)BStack_208.ptr;
      }
      goto LAB_0021e056;
    }
    if (sVar13 != 0) {
      return sVar13;
    }
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar7 = *cSrc;
  uVar23 = (ulong)uVar7;
  uVar8 = *(ushort *)((long)cSrc + 2);
  uVar9 = *(ushort *)((long)cSrc + 4);
  uVar17 = uVar23 + uVar8 + (ulong)uVar9 + 6;
  if ((maxDstSize < 6) || (cSrcSize < uVar17)) {
LAB_0021ebdd:
    sVar13 = 0xffffffffffffffec;
  }
  else {
    puStack_198 = (undefined1 *)((long)dst + maxDstSize);
    uVar20 = maxDstSize + 3 >> 2;
    puStack_110 = (undefined1 *)((long)dst + uVar20);
    puStack_158 = puStack_110 + uVar20;
    puStack_118 = puStack_158 + uVar20;
    if (puStack_198 < puStack_118) goto LAB_0021ebdd;
    if (uVar7 != 0) {
      HStack_108.ip[3] = (BYTE *)((long)cSrc + 6);
      BStack_208.start = (char *)((long)cSrc + uVar23 + 6);
      uStack_190 = (ulong)*(ushort *)((long)DTable + 2);
      HStack_108.op[0] = (BYTE *)((long)cSrc + 0xe);
      if (uVar7 < 8) {
        HStack_108.ip[0] = (BYTE *)(ulong)*HStack_108.ip[3];
        switch(uVar7) {
        case 2:
          goto LAB_0021e176;
        case 3:
          goto LAB_0021e16b;
        case 4:
          break;
        case 7:
          HStack_108.ip[0] =
               (BYTE *)((ulong)HStack_108.ip[0] | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30);
        case 6:
          HStack_108.ip[0] = HStack_108.ip[0] + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
        case 5:
          HStack_108.ip[0] = HStack_108.ip[0] + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
          break;
        default:
          goto switchD_0021e11f_default;
        }
        HStack_108.ip[0] = HStack_108.ip[0] + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_0021e16b:
        HStack_108.ip[0] = HStack_108.ip[0] + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_0021e176:
        HStack_108.ip[0] = HStack_108.ip[0] + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
switchD_0021e11f_default:
        bVar16 = *(byte *)((long)cSrc + uVar23 + 5);
        if (bVar16 == 0) goto LAB_0021ebdd;
        uVar30 = 0x1f;
        if (bVar16 != 0) {
          for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
          }
        }
        uStack_214 = (uVar30 ^ 0x1f) + (uint)uVar7 * -8 + 0x29;
        HStack_108.ip[2] = HStack_108.ip[3];
      }
      else {
        HStack_108.ip[0] = *(BYTE **)((long)cSrc + (uVar23 - 2));
        if ((ulong)HStack_108.ip[0] >> 0x38 == 0) {
          return 0xffffffffffffffff;
        }
        uVar30 = 0x1f;
        bVar16 = (byte)((ulong)HStack_108.ip[0] >> 0x38);
        if (bVar16 != 0) {
          for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
          }
        }
        uStack_214 = ~uVar30 + 9;
        HStack_108.ip[2] = (BYTE *)((long)cSrc + (uVar23 - 2));
      }
      if (uVar8 != 0) {
        puStack_1b0 = (ulong *)((ulong)uVar8 + (long)BStack_208.start);
        BStack_208.limitPtr = (char *)((long)cSrc + uVar23 + 0xe);
        if (uVar8 < 8) {
          BStack_208.bitContainer = (size_t)(byte)*(ulong *)BStack_208.start;
          switch(uVar8) {
          case 7:
            BStack_208.bitContainer =
                 BStack_208.bitContainer | (ulong)*(byte *)((long)cSrc + uVar23 + 0xc) << 0x30;
          case 6:
            BStack_208.bitContainer =
                 BStack_208.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar23 + 0xb) << 0x28);
          case 5:
            BStack_208.bitContainer =
                 BStack_208.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar23 + 10) << 0x20);
          case 4:
            BStack_208.bitContainer =
                 BStack_208.bitContainer + (ulong)*(byte *)((long)cSrc + uVar23 + 9) * 0x1000000;
          case 3:
            BStack_208.bitContainer =
                 BStack_208.bitContainer + (ulong)*(byte *)((long)cSrc + uVar23 + 8) * 0x10000;
          case 2:
            BStack_208.bitContainer =
                 BStack_208.bitContainer + (ulong)*(byte *)((long)cSrc + uVar23 + 7) * 0x100;
          }
          bVar16 = *(byte *)((long)puStack_1b0 + -1);
          if (bVar16 == 0) goto LAB_0021ebdd;
          uVar30 = 0x1f;
          if (bVar16 != 0) {
            for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          BStack_208.bitsConsumed = (uVar30 ^ 0x1f) + (uint)uVar8 * -8 + 0x29;
          puStack_120 = (ulong *)BStack_208.start;
        }
        else {
          puStack_120 = puStack_1b0 + -1;
          BStack_208.bitContainer = puStack_1b0[-1];
          if (BStack_208.bitContainer >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar30 = 0x1f;
          bVar16 = (byte)(BStack_208.bitContainer >> 0x38);
          if (bVar16 != 0) {
            for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          BStack_208.bitsConsumed = ~uVar30 + 9;
        }
        sVar13 = BStack_208.bitContainer;
        psStack_128 = (size_t *)CONCAT44(psStack_128._4_4_,BStack_208.bitsConsumed);
        if (uVar9 == 0) {
          return 0xffffffffffffffb8;
        }
        srcBuffer = (byte *)((ulong)uVar9 + (long)puStack_1b0);
        puStack_1a8 = puStack_1b0 + 1;
        if (uVar9 < 8) {
          auStack_1c8._0_8_ = ZEXT18((byte)*puStack_1b0);
          switch(uVar9) {
          case 7:
            auStack_1c8._0_8_ = auStack_1c8._0_8_ | (ulong)*(byte *)((long)puStack_1b0 + 6) << 0x30;
          case 6:
            auStack_1c8._0_8_ =
                 auStack_1c8._0_8_ + ((ulong)*(byte *)((long)puStack_1b0 + 5) << 0x28);
          case 5:
            auStack_1c8._0_8_ =
                 auStack_1c8._0_8_ + ((ulong)*(byte *)((long)puStack_1b0 + 4) << 0x20);
          case 4:
            auStack_1c8._0_8_ =
                 auStack_1c8._0_8_ + (ulong)*(byte *)((long)puStack_1b0 + 3) * 0x1000000;
          case 3:
            auStack_1c8._0_8_ =
                 auStack_1c8._0_8_ + (ulong)*(byte *)((long)puStack_1b0 + 2) * 0x10000;
          case 2:
            auStack_1c8._0_8_ = auStack_1c8._0_8_ + (ulong)*(byte *)((long)puStack_1b0 + 1) * 0x100;
          }
          bVar16 = srcBuffer[-1];
          if (bVar16 == 0) goto LAB_0021ebdd;
          uVar30 = 0x1f;
          if (bVar16 != 0) {
            for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          uStack_1cc = (uVar30 ^ 0x1f) + (uint)uVar9 * -8 + 0x29;
          puStack_140 = puStack_1b0;
        }
        else {
          puStack_140 = (ulong *)(srcBuffer + -8);
          auStack_1c8._0_8_ = *(undefined8 *)(srcBuffer + -8);
          if ((ulong)auStack_1c8._0_8_ >> 0x38 == 0) {
            return 0xffffffffffffffff;
          }
          uVar30 = 0x1f;
          bVar16 = (byte)((ulong)auStack_1c8._0_8_ >> 0x38);
          if (bVar16 != 0) {
            for (; bVar16 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          uStack_1cc = ~uVar30 + 9;
        }
        BStack_208.ptr = (char *)puStack_120;
        pBStack_1d8 = HStack_108.ip[0];
        puStack_1b8 = puStack_140;
        uStack_160 = auStack_1c8._0_8_;
        puStack_150 = (ulong *)HStack_108.ip[2];
        puStack_68 = (ulong *)HStack_108.ip[3];
        puStack_58 = (ulong *)HStack_108.op[0];
        puStack_40 = puStack_1a8;
        puStack_38 = (ulong *)BStack_208.limitPtr;
        HStack_108.ip[1]._0_4_ = uStack_214;
        auStack_1c8._8_4_ = uStack_1cc;
        sVar15 = BIT_initDStream((BIT_DStream_t *)auStack_188,srcBuffer,cSrcSize - uVar17);
        puVar2 = puStack_110;
        if (0xffffffffffffff88 < sVar15) {
          return sVar15;
        }
        puStack_60 = (undefined1 *)((long)dst + (sStack_148 - 3));
        puVar21 = puStack_158;
        puVar39 = puStack_110;
        if ((ulong)((long)puStack_198 - (long)puStack_118) < 8) {
          puStack_210 = puStack_118;
        }
        else {
          if (puStack_118 < puStack_60) {
            sStack_138 = (size_t)auStack_188;
            uStack_130 = sVar13;
            if ((char)uStack_190 == '\0') goto LAB_0021f54d;
            uVar31 = -(int)uStack_190 & 0x3f;
            uStack_48 = (ulong)uVar31;
            psStack_50 = psStack_168;
            lVar14 = uVar20 * 3;
            uVar30 = (uint)pBStack_180;
            do {
              psVar38 = psStack_178;
              puVar21 = (undefined1 *)dst;
              sVar10 = (sbyte)uVar31;
              uVar23 = (ulong)((long)pBStack_1d8 << ((byte)uStack_214 & 0x3f)) >> sVar10;
              uVar17 = (uStack_130 << ((byte)(uint)psStack_128 & 0x3f)) >> sVar10;
              uVar33 = (uStack_160 << ((byte)uStack_1cc & 0x3f)) >> sVar10;
              iVar11 = *(byte *)((long)DTable + uVar23 * 2 + 4) + uStack_214;
              uVar34 = (sStack_138 << ((byte)uVar30 & 0x3f)) >> sVar10;
              uVar36 = (ulong)((long)pBStack_1d8 << ((byte)iVar11 & 0x3f)) >> sVar10;
              *puVar21 = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              iVar26 = *(byte *)((long)DTable + uVar17 * 2 + 4) + (uint)psStack_128;
              puVar21[uVar20] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              iVar28 = *(byte *)((long)DTable + uVar33 * 2 + 4) + uStack_1cc;
              puVar21[uVar20 * 2] = *(undefined1 *)((long)DTable + uVar33 * 2 + 5);
              iVar32 = *(byte *)((long)DTable + uVar34 * 2 + 4) + uVar30;
              puVar21[lVar14] = *(undefined1 *)((long)DTable + uVar34 * 2 + 5);
              uVar23 = (uStack_130 << ((byte)iVar26 & 0x3f)) >> sVar10;
              uVar33 = (uStack_160 << ((byte)iVar28 & 0x3f)) >> sVar10;
              iVar11 = (uint)*(byte *)((long)DTable + uVar36 * 2 + 4) + iVar11;
              uVar17 = (sStack_138 << ((byte)iVar32 & 0x3f)) >> sVar10;
              uVar34 = (ulong)((long)pBStack_1d8 << ((byte)iVar11 & 0x3f)) >> sVar10;
              puVar21[1] = *(undefined1 *)((long)DTable + uVar36 * 2 + 5);
              iVar26 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar26;
              puVar21[uVar20 + 1] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              iVar28 = (uint)*(byte *)((long)DTable + uVar33 * 2 + 4) + iVar28;
              puVar21[uVar20 * 2 + 1] = *(undefined1 *)((long)DTable + uVar33 * 2 + 5);
              iVar32 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar32;
              puVar21[lVar14 + 1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              iVar11 = (uint)*(byte *)((long)DTable + uVar34 * 2 + 4) + iVar11;
              puVar21[2] = *(undefined1 *)((long)DTable + uVar34 * 2 + 5);
              uVar23 = (uStack_130 << ((byte)iVar26 & 0x3f)) >> sVar10;
              uVar17 = (uStack_160 << ((byte)iVar28 & 0x3f)) >> sVar10;
              iVar26 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar26;
              uVar33 = (sStack_138 << ((byte)iVar32 & 0x3f)) >> sVar10;
              uVar34 = (ulong)((long)pBStack_1d8 << ((byte)iVar11 & 0x3f)) >> sVar10;
              puVar21[uVar20 + 2] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              iVar28 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar28;
              puVar21[uVar20 * 2 + 2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              iVar32 = (uint)*(byte *)((long)DTable + uVar33 * 2 + 4) + iVar32;
              puVar21[lVar14 + 2] = *(undefined1 *)((long)DTable + uVar33 * 2 + 5);
              uStack_214 = (uint)*(byte *)((long)DTable + uVar34 * 2 + 4) + iVar11;
              puVar21[3] = *(undefined1 *)((long)DTable + uVar34 * 2 + 5);
              uVar23 = (uStack_130 << ((byte)iVar26 & 0x3f)) >> sVar10;
              bVar16 = *(byte *)((long)DTable + uVar23 * 2 + 4);
              puVar21[uVar20 + 3] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (uStack_160 << ((byte)iVar28 & 0x3f)) >> sVar10;
              bVar4 = *(byte *)((long)DTable + uVar23 * 2 + 4);
              puVar21[uVar20 * 2 + 3] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (sStack_138 << ((byte)iVar32 & 0x3f)) >> sVar10;
              bVar5 = *(byte *)((long)DTable + uVar23 * 2 + 4);
              puVar21[lVar14 + 3] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              iVar11 = 3;
              if (puStack_150 < puStack_58) {
                iVar22 = 3;
                puVar24 = puStack_150;
              }
              else {
                if (0x40 < uStack_214) goto LAB_0021f52e;
                puVar24 = (ulong *)((long)puStack_150 - (ulong)(uStack_214 >> 3));
                uStack_214 = uStack_214 & 7;
                pBStack_1d8 = (BYTE *)*puVar24;
                iVar22 = 0;
              }
              psStack_128._0_4_ = iVar26 + (uint)bVar16;
              if (puStack_38 <= puStack_120) {
                if (0x40 < (uint)psStack_128) goto LAB_0021f52e;
                puStack_120 = (ulong *)((long)puStack_120 - (ulong)((uint)psStack_128 >> 3));
                psStack_128._0_4_ = (uint)psStack_128 & 7;
                uStack_130 = *puStack_120;
                iVar11 = 0;
              }
              uVar30 = iVar28 + (uint)bVar4;
              iVar28 = 3;
              if (puStack_140 < puStack_40) {
                iVar26 = 3;
                uStack_1cc = uVar30;
              }
              else {
                if (0x40 < uVar30) goto LAB_0021f52e;
                puStack_140 = (ulong *)((long)puStack_140 - (ulong)(uVar30 >> 3));
                uStack_160 = *puStack_140;
                iVar26 = 0;
                uStack_1cc = uVar30 & 7;
              }
              uVar30 = iVar32 + (uint)bVar5;
              psStack_178 = psVar38;
              if (psStack_168 <= psVar38) {
                if (0x40 < uVar30) {
LAB_0021f52e:
                  psStack_128 = psVar38;
                  __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                                ,0x185,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
                }
                psStack_178 = (size_t *)((long)psVar38 - (ulong)(uVar30 >> 3));
                uVar30 = uVar30 & 7;
                sStack_138 = *psStack_178;
                iVar28 = 0;
              }
              puStack_150 = puVar24;
            } while ((puVar21 + lVar14 + 4 < puStack_60) &&
                    (dst = puVar21 + 4, ((iVar11 == 0 && iVar22 == 0) && iVar26 == 0) && iVar28 == 0
                    ));
            dst = puVar21 + 4;
            auStack_1c8._8_4_ = uStack_1cc;
            pBStack_180 = (BYTE *)CONCAT44(pBStack_180._4_4_,uVar30);
            puStack_1b8 = puStack_140;
            puStack_210 = (undefined1 *)((long)dst + lVar14);
            auStack_188 = (undefined1  [8])sStack_138;
            sVar13 = uStack_130;
            puVar21 = (undefined1 *)((long)dst + uVar20 * 2);
            puVar39 = (undefined1 *)((long)dst + uVar20);
            BStack_208.ptr = (char *)puStack_120;
            HStack_108.ip[2] = (BYTE *)puVar24;
            HStack_108.ip[1]._0_4_ = uStack_214;
            BStack_208.bitsConsumed = (uint)psStack_128;
          }
          else {
            puStack_210 = puStack_118;
            psVar38 = psStack_128;
          }
          psStack_128 = psVar38;
          HStack_108.ip[0] = pBStack_1d8;
          auStack_1c8._0_8_ = uStack_160;
          BStack_208.bitContainer = sVar13;
        }
        if ((dst <= puStack_110) && (puVar39 <= puStack_158)) {
          if (puStack_118 < puVar21) {
            return 0xffffffffffffffec;
          }
          uVar23 = uStack_190;
          puVar35 = puStack_198;
          if ((long)puStack_110 - (long)dst < 4) {
            if (uStack_214 < 0x41) {
              if (puStack_150 < puStack_58) {
                if (puStack_150 != puStack_68) {
                  uVar30 = (int)puStack_150 - (int)puStack_68;
                  if (puStack_68 <= (ulong *)((long)puStack_150 - (ulong)(uStack_214 >> 3))) {
                    uVar30 = uStack_214 >> 3;
                  }
                  HStack_108.ip[2] = (BYTE *)((long)puStack_150 - (ulong)uVar30);
                  HStack_108.ip[1]._0_4_ = uStack_214 + uVar30 * -8;
                  HStack_108.ip[0] = *(BYTE **)HStack_108.ip[2];
                }
              }
              else {
                BIT_reloadDStreamFast((BIT_DStream_t *)&HStack_108);
                uVar23 = uStack_190;
                puVar35 = puStack_198;
              }
            }
          }
          else if (uStack_214 < 0x41) {
            puVar1 = puStack_110 + -3;
            pBStack_1d8 = (BYTE *)(ulong)(-(int)uStack_190 & 0x3f);
            do {
              if (HStack_108.ip[2] < HStack_108.op[0]) {
                if (HStack_108.ip[2] == HStack_108.ip[3]) break;
                bVar40 = (ulong *)((long)HStack_108.ip[2] - (ulong)(uStack_214 >> 3)) <
                         HStack_108.ip[3];
                uVar30 = (int)HStack_108.ip[2] - (int)HStack_108.ip[3];
                if (!bVar40) {
                  uVar30 = uStack_214 >> 3;
                }
                BVar12 = (BIT_DStream_status)bVar40;
                HStack_108.ip[2] = (BYTE *)((long)HStack_108.ip[2] - (ulong)uVar30);
                HStack_108.ip[1]._0_4_ = uStack_214 + uVar30 * -8;
                HStack_108.ip[0] = *(BYTE **)HStack_108.ip[2];
              }
              else {
                BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)&HStack_108);
                uVar23 = uStack_190;
                puVar35 = puStack_198;
              }
              if ((puVar1 <= dst) || (BVar12 != BIT_DStream_unfinished)) break;
              if ((char)uVar23 == '\0') goto LAB_0021f54d;
              bVar16 = (byte)pBStack_1d8;
              uVar17 = (ulong)((long)HStack_108.ip[0] << ((byte)(uint)HStack_108.ip[1] & 0x3f)) >>
                       (bVar16 & 0x3f);
              iVar11 = *(byte *)((long)DTable + uVar17 * 2 + 4) + (uint)HStack_108.ip[1];
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)((long)HStack_108.ip[0] << ((byte)iVar11 & 0x3f)) >> (bVar16 & 0x3f);
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)((long)HStack_108.ip[0] << ((byte)iVar11 & 0x3f)) >> (bVar16 & 0x3f);
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)((long)HStack_108.ip[0] << ((byte)iVar11 & 0x3f)) >> (bVar16 & 0x3f);
              uStack_214 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              dst = (void *)((long)dst + 4);
              HStack_108.ip[1]._0_4_ = uStack_214;
              if (0x40 < uStack_214) break;
            } while( true );
          }
          cVar29 = (char)uVar23;
          if (dst < puVar2) {
            if (cVar29 == '\0') goto LAB_0021f54d;
            do {
              uVar17 = (ulong)((long)HStack_108.ip[0] << ((byte)(uint)HStack_108.ip[1] & 0x3f)) >>
                       (-cVar29 & 0x3fU);
              HStack_108.ip[1]._0_4_ =
                   *(byte *)((long)DTable + uVar17 * 2 + 4) + (uint)HStack_108.ip[1];
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              dst = (void *)((long)dst + 1);
            } while (dst < puVar2);
          }
          if ((long)puStack_158 - (long)puVar39 < 4) {
            if (BStack_208.bitsConsumed < 0x41) {
              if (BStack_208.ptr < BStack_208.limitPtr) {
                if (BStack_208.ptr != BStack_208.start) {
                  uVar30 = (int)BStack_208.ptr - (int)BStack_208.start;
                  if (BStack_208.start <=
                      (ulong *)((long)BStack_208.ptr - (ulong)(BStack_208.bitsConsumed >> 3))) {
                    uVar30 = BStack_208.bitsConsumed >> 3;
                  }
                  BStack_208.ptr = (char *)((long)BStack_208.ptr - (ulong)uVar30);
                  BStack_208.bitsConsumed = BStack_208.bitsConsumed + uVar30 * -8;
                  BStack_208.bitContainer = *(size_t *)BStack_208.ptr;
                }
              }
              else {
                BIT_reloadDStreamFast(&BStack_208);
                uVar23 = uStack_190;
                puVar35 = puStack_198;
              }
            }
          }
          else if (BStack_208.bitsConsumed < 0x41) {
            puVar2 = puStack_158 + -3;
            bVar16 = -cVar29 & 0x3f;
            do {
              if (BStack_208.ptr < BStack_208.limitPtr) {
                if (BStack_208.ptr == BStack_208.start) break;
                bVar40 = (ulong *)((long)BStack_208.ptr - (ulong)(BStack_208.bitsConsumed >> 3)) <
                         BStack_208.start;
                uVar30 = (int)BStack_208.ptr - (int)BStack_208.start;
                if (!bVar40) {
                  uVar30 = BStack_208.bitsConsumed >> 3;
                }
                BVar12 = (BIT_DStream_status)bVar40;
                BStack_208.ptr = (char *)((long)BStack_208.ptr - (ulong)uVar30);
                BStack_208.bitsConsumed = BStack_208.bitsConsumed + uVar30 * -8;
                BStack_208.bitContainer = *(size_t *)BStack_208.ptr;
              }
              else {
                BVar12 = BIT_reloadDStreamFast(&BStack_208);
                puVar35 = puStack_198;
              }
              uVar23 = uStack_190;
              if ((puVar2 <= puVar39) || (BVar12 != BIT_DStream_unfinished)) break;
              if ((char)uStack_190 == '\0') goto LAB_0021f54d;
              uVar17 = (BStack_208.bitContainer << ((byte)BStack_208.bitsConsumed & 0x3f)) >> bVar16
              ;
              iVar11 = *(byte *)((long)DTable + uVar17 * 2 + 4) + BStack_208.bitsConsumed;
              *puVar39 = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (BStack_208.bitContainer << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar39[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (BStack_208.bitContainer << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar39[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (BStack_208.bitContainer << ((byte)iVar11 & 0x3f)) >> bVar16;
              BStack_208.bitsConsumed = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar39[3] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              puVar39 = puVar39 + 4;
              if (0x40 < BStack_208.bitsConsumed) break;
            } while( true );
          }
          cVar29 = (char)uVar23;
          if (puVar39 < puStack_158) {
            if (cVar29 == '\0') goto LAB_0021f54d;
            do {
              uVar17 = (BStack_208.bitContainer << ((byte)BStack_208.bitsConsumed & 0x3f)) >>
                       (-cVar29 & 0x3fU);
              BStack_208.bitsConsumed =
                   *(byte *)((long)DTable + uVar17 * 2 + 4) + BStack_208.bitsConsumed;
              *puVar39 = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              puVar39 = puVar39 + 1;
            } while (puVar39 < puStack_158);
          }
          if ((long)puStack_118 - (long)puVar21 < 4) {
            if ((uint)auStack_1c8._8_4_ < 0x41) {
              if (puStack_1b8 < puStack_1a8) {
                if (puStack_1b8 != puStack_1b0) {
                  uVar30 = (int)puStack_1b8 - (int)puStack_1b0;
                  if (puStack_1b0 <=
                      (ulong *)((long)puStack_1b8 - (ulong)((uint)auStack_1c8._8_4_ >> 3))) {
                    uVar30 = (uint)auStack_1c8._8_4_ >> 3;
                  }
                  puStack_1b8 = (ulong *)((long)puStack_1b8 - (ulong)uVar30);
                  auStack_1c8._8_4_ = auStack_1c8._8_4_ + uVar30 * -8;
                  auStack_1c8._0_8_ = *puStack_1b8;
                }
              }
              else {
                BIT_reloadDStreamFast((BIT_DStream_t *)auStack_1c8);
                uVar23 = uStack_190;
                puVar35 = puStack_198;
              }
            }
          }
          else if ((uint)auStack_1c8._8_4_ < 0x41) {
            puVar2 = puStack_118 + -3;
            bVar16 = -cVar29 & 0x3f;
            do {
              if (puStack_1b8 < puStack_1a8) {
                if (puStack_1b8 == puStack_1b0) break;
                bVar40 = (ulong *)((long)puStack_1b8 - (ulong)((uint)auStack_1c8._8_4_ >> 3)) <
                         puStack_1b0;
                uVar30 = (int)puStack_1b8 - (int)puStack_1b0;
                if (!bVar40) {
                  uVar30 = (uint)auStack_1c8._8_4_ >> 3;
                }
                BVar12 = (BIT_DStream_status)bVar40;
                puStack_1b8 = (ulong *)((long)puStack_1b8 - (ulong)uVar30);
                auStack_1c8._8_4_ = auStack_1c8._8_4_ + uVar30 * -8;
                auStack_1c8._0_8_ = *puStack_1b8;
              }
              else {
                BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)auStack_1c8);
                puVar35 = puStack_198;
              }
              uVar23 = uStack_190;
              if ((puVar2 <= puVar21) || (BVar12 != BIT_DStream_unfinished)) break;
              if ((char)uStack_190 == '\0') goto LAB_0021f54d;
              uVar17 = (ulong)(auStack_1c8._0_8_ << ((byte)auStack_1c8._8_4_ & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + auStack_1c8._8_4_;
              *puVar21 = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)(auStack_1c8._0_8_ << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar21[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)(auStack_1c8._0_8_ << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar21[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              uVar17 = (ulong)(auStack_1c8._0_8_ << ((byte)iVar11 & 0x3f)) >> bVar16;
              auStack_1c8._8_4_ = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar11;
              puVar21[3] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              puVar21 = puVar21 + 4;
              if (0x40 < (uint)auStack_1c8._8_4_) break;
            } while( true );
          }
          puVar2 = puStack_60;
          sVar13 = sStack_148;
          cVar29 = (char)uVar23;
          if (puVar21 < puStack_118) {
            if (cVar29 == '\0') goto LAB_0021f54d;
            do {
              uVar17 = (ulong)(auStack_1c8._0_8_ << ((byte)auStack_1c8._8_4_ & 0x3f)) >>
                       (-cVar29 & 0x3fU);
              auStack_1c8._8_4_ = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + auStack_1c8._8_4_
              ;
              *puVar21 = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
              puVar21 = puVar21 + 1;
            } while (puVar21 < puStack_118);
          }
          if ((long)puVar35 - (long)puStack_210 < 4) {
            if ((uint)pBStack_180 < 0x41) {
              if (psStack_178 < psStack_168) {
                if (psStack_178 != psStack_170) {
                  uVar30 = (int)psStack_178 - (int)psStack_170;
                  if (psStack_170 <= (size_t *)((long)psStack_178 - (ulong)((uint)pBStack_180 >> 3))
                     ) {
                    uVar30 = (uint)pBStack_180 >> 3;
                  }
                  psStack_178 = (size_t *)((long)psStack_178 - (ulong)uVar30);
                  pBStack_180 = (BYTE *)CONCAT44(pBStack_180._4_4_,(uint)pBStack_180 + uVar30 * -8);
                  auStack_188 = (undefined1  [8])*psStack_178;
                }
              }
              else {
                BIT_reloadDStreamFast((BIT_DStream_t *)auStack_188);
                cVar29 = (char)uStack_190;
                puVar35 = puStack_198;
              }
            }
          }
          else if ((uint)pBStack_180 < 0x41) {
            bVar16 = -cVar29 & 0x3f;
            uVar30 = (uint)pBStack_180;
            do {
              cVar29 = (char)uVar23;
              if (psStack_178 < psStack_168) {
                if (psStack_178 == psStack_170) break;
                bVar40 = (size_t *)((long)psStack_178 - (ulong)(uVar30 >> 3)) < psStack_170;
                uVar31 = (int)psStack_178 - (int)psStack_170;
                if (!bVar40) {
                  uVar31 = uVar30 >> 3;
                }
                BVar12 = (BIT_DStream_status)bVar40;
                psStack_178 = (size_t *)((long)psStack_178 - (ulong)uVar31);
                pBStack_180 = (BYTE *)CONCAT44(pBStack_180._4_4_,uVar30 + uVar31 * -8);
                auStack_188 = (undefined1  [8])*psStack_178;
              }
              else {
                BVar12 = BIT_reloadDStreamFast((BIT_DStream_t *)auStack_188);
                puVar35 = puStack_198;
              }
              cVar29 = (char)uStack_190;
              if ((puVar2 <= puStack_210) || (BVar12 != BIT_DStream_unfinished)) break;
              if (cVar29 == '\0') goto LAB_0021f54d;
              uVar23 = (ulong)((long)auStack_188 << ((byte)pBStack_180 & 0x3f)) >> bVar16;
              iVar11 = *(byte *)((long)DTable + uVar23 * 2 + 4) + (uint)pBStack_180;
              *puStack_210 = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (ulong)((long)auStack_188 << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
              puStack_210[1] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (ulong)((long)auStack_188 << ((byte)iVar11 & 0x3f)) >> bVar16;
              iVar11 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
              puStack_210[2] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              uVar23 = (ulong)((long)auStack_188 << ((byte)iVar11 & 0x3f)) >> bVar16;
              uVar30 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 4) + iVar11;
              pBStack_180 = (BYTE *)CONCAT44(pBStack_180._4_4_,uVar30);
              puStack_210[3] = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              puStack_210 = puStack_210 + 4;
              uVar23 = uStack_190;
              if (0x40 < uVar30) break;
            } while( true );
          }
          if (puStack_210 < puVar35) {
            if (cVar29 == '\0') {
LAB_0021f54d:
              __assert_fail("nbBits >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                            ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
            }
            do {
              uVar23 = (ulong)((long)auStack_188 << ((byte)pBStack_180 & 0x3f)) >> (-cVar29 & 0x3fU)
              ;
              pBStack_180 = (BYTE *)(ulong)(*(byte *)((long)DTable + uVar23 * 2 + 4) +
                                           (uint)pBStack_180);
              *puStack_210 = *(undefined1 *)((long)DTable + uVar23 * 2 + 5);
              puStack_210 = puStack_210 + 1;
            } while (puStack_210 < puVar35);
          }
          if ((uint)pBStack_180 != 0x40) {
            sVar13 = 0xffffffffffffffec;
          }
          if (psStack_178 != psStack_170) {
            sVar13 = 0xffffffffffffffec;
          }
          if (auStack_1c8._8_4_ != 0x40) {
            sVar13 = 0xffffffffffffffec;
          }
          if (puStack_1b8 != puStack_1b0) {
            sVar13 = 0xffffffffffffffec;
          }
          if (BStack_208.bitsConsumed != 0x40) {
            sVar13 = 0xffffffffffffffec;
          }
          if (BStack_208.ptr != BStack_208.start) {
            sVar13 = 0xffffffffffffffec;
          }
          if ((uint)HStack_108.ip[1] != 0x40) {
            sVar13 = 0xffffffffffffffec;
          }
          if (HStack_108.ip[2] == HStack_108.ip[3]) {
            return sVar13;
          }
          return 0xffffffffffffffec;
        }
        goto LAB_0021ebdd;
      }
    }
    sVar13 = 0xffffffffffffffb8;
  }
  return sVar13;
LAB_0021e015:
  maxDstSize = sStack_148;
LAB_0021e027:
  pBVar37 = pBStack_1d8;
LAB_0021e056:
  if (pBVar27 < dst) {
    lVar25 = 0;
    do {
      uVar23 = (BStack_208.bitContainer << ((byte)BStack_208.bitsConsumed & 0x3f)) >> 0x35;
      BStack_208.bitsConsumed = *(byte *)((long)DTable + uVar23 * 2 + 4) + BStack_208.bitsConsumed;
      pBVar27[lVar25] = *(BYTE *)((long)DTable + uVar23 * 2 + 5);
      lVar25 = lVar25 + 1;
    } while ((long)dst - (long)pBVar27 != lVar25);
    pBVar19 = HStack_108.op[lVar14];
  }
  HStack_108.op[lVar14] = pBVar19 + lVar18;
  if (pBVar19 + lVar18 != (BYTE *)dst) {
    return 0xffffffffffffffec;
  }
  lVar14 = lVar14 + 1;
  if (lVar14 == 4) {
    if (maxDstSize != 0) {
      return maxDstSize;
    }
    __assert_fail("dstSize != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                  ,0x348,
                  "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
  goto LAB_0021de81;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}